

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void flatcc_json_printer_union_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_union_type_f *ptf,
               flatcc_json_printer_union_f *pf)

{
  uint8_t n;
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  void *pvVar8;
  flatcc_json_printer_union_descriptor_t ud;
  flatcc_json_printer_union_descriptor_t local_40;
  
  uVar2 = id * 2 + 2;
  if ((uVar2 < (uint)td->vsize) &&
     (uVar5 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar2), uVar5 != 0)) {
    puVar3 = (uint8_t *)(uVar5 + (long)td->table);
  }
  else {
    puVar3 = (uint8_t *)0x0;
  }
  uVar2 = id * 2 + 4;
  if ((uVar2 < (uint)td->vsize) &&
     (uVar5 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar2), uVar5 != 0)) {
    pvVar8 = (void *)(uVar5 + (long)td->table);
  }
  else {
    pvVar8 = (void *)0x0;
  }
  if ((pvVar8 != (void *)0x0) && (puVar3 != (uint8_t *)0x0)) {
    n = *puVar3;
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar6 = ctx->p;
      ctx->p = pcVar6 + 1;
      *pcVar6 = ',';
    }
    pcVar6 = ctx->p;
    if (ctx->indent == '\0') {
      if (ctx->pflush <= pcVar6) {
        (*ctx->flush)(ctx,0);
      }
    }
    else {
      ctx->p = pcVar6 + 1;
      *pcVar6 = '\n';
      sVar4 = (ulong)ctx->indent * (long)ctx->level;
      pcVar6 = ctx->p;
      if (ctx->pflush < pcVar6 + sVar4) {
        if (ctx->pflush <= pcVar6) {
          (*ctx->flush)(ctx,0);
        }
        sVar7 = (long)ctx->pflush - (long)ctx->p;
        if (sVar7 < sVar4) {
          do {
            memset(ctx->p,0x20,sVar7);
            ctx->p = ctx->p + sVar7;
            sVar4 = sVar4 - sVar7;
            (*ctx->flush)(ctx,0);
            sVar7 = (long)ctx->pflush - (long)ctx->p;
          } while (sVar7 < sVar4);
        }
        pcVar6 = ctx->p;
      }
      memset(pcVar6,0x20,sVar4);
      ctx->p = ctx->p + sVar4;
    }
    *ctx->p = '\"';
    pcVar6 = ctx->p + (ctx->unquote == '\0');
    ctx->p = pcVar6;
    uVar5 = len;
    if (pcVar6 + len < ctx->pflush) {
      memcpy(pcVar6,name,len);
    }
    else {
      if (ctx->pflush <= pcVar6) {
        (*ctx->flush)(ctx,0);
      }
      sVar4 = (long)ctx->pflush - (long)ctx->p;
      pcVar6 = name;
      if (sVar4 < len) {
        do {
          memcpy(ctx->p,pcVar6,sVar4);
          ctx->p = ctx->p + sVar4;
          pcVar6 = pcVar6 + sVar4;
          uVar5 = uVar5 - sVar4;
          (*ctx->flush)(ctx,0);
          sVar4 = (long)ctx->pflush - (long)ctx->p;
        } while (sVar4 < uVar5);
      }
      memcpy(ctx->p,pcVar6,uVar5);
    }
    pcVar6 = ctx->p;
    ctx->p = pcVar6 + uVar5;
    if (pcVar6 + uVar5 + 5 < ctx->pflush) {
      builtin_strncpy(pcVar6 + uVar5,"_type",5);
      sVar7 = 5;
    }
    else {
      if (ctx->pflush <= pcVar6 + uVar5) {
        (*ctx->flush)(ctx,0);
      }
      sVar4 = (long)ctx->pflush - (long)ctx->p;
      if (sVar4 < 5) {
        pcVar6 = "_type";
        sVar7 = 5;
        do {
          memcpy(ctx->p,pcVar6,sVar4);
          ctx->p = ctx->p + sVar4;
          pcVar6 = pcVar6 + sVar4;
          sVar7 = sVar7 - sVar4;
          (*ctx->flush)(ctx,0);
          sVar4 = (long)ctx->pflush - (long)ctx->p;
        } while (sVar4 < sVar7);
      }
      else {
        sVar7 = 5;
        pcVar6 = "_type";
      }
      memcpy(ctx->p,pcVar6,sVar7);
    }
    pcVar6 = ctx->p;
    ctx->p = pcVar6 + sVar7;
    pcVar6[sVar7] = '\"';
    pcVar6 = ctx->p;
    ctx->p = pcVar6 + (ctx->unquote == '\0') + 1;
    pcVar6[ctx->unquote == '\0'] = ':';
    *ctx->p = ' ';
    pcVar6 = ctx->p;
    ctx->p = pcVar6 + (ctx->indent != '\0');
    if (ctx->noenum == '\0') {
      (*ptf)(ctx,n);
    }
    else {
      uVar2 = print_uint8(n,pcVar6 + (ctx->indent != '\0'));
      ctx->p = ctx->p + uVar2;
    }
    if (n != '\0') {
      pcVar6 = ctx->p;
      ctx->p = pcVar6 + 1;
      *pcVar6 = ',';
      print_name(ctx,name,len);
      local_40.ttl = td->ttl;
      local_40.member = pvVar8;
      local_40.type = n;
      (*pf)(ctx,&local_40);
    }
  }
  return;
}

Assistant:

void flatcc_json_printer_union_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        flatcc_json_printer_union_type_f ptf,
        flatcc_json_printer_union_f pf)
{
    const void *pt = get_field_ptr(td, id - 1);
    const void *p = get_field_ptr(td, id);
    utype_t type;
    flatcc_json_printer_union_descriptor_t ud;

    if (!p || !pt) {
        return;
    }
    type = __flatbuffers_utype_read_from_pe(pt);
    if (td->count++) {
        print_char(',');
    }
    print_nl();
    *ctx->p = '\"';
    ctx->p += !ctx->unquote;
    if (ctx->p + len < ctx->pflush) {
        memcpy(ctx->p, name, len);
        ctx->p += len;
    } else {
        print(ctx, name, len);
    }
    print(ctx, "_type", 5);
    *ctx->p = '\"';
    ctx->p += !ctx->unquote;
    print_char(':');
    print_space();
    if (ctx->noenum) {
        ctx->p += print_utype(type, ctx->p);
    } else {
        ptf(ctx, type);
    }
    if (type != 0) {
        print_char(',');
        print_name(ctx, name, len);
        ud.ttl = td->ttl;
        ud.type = type;
        ud.member = p;
        pf(ctx, &ud);
    }
}